

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.h
# Opt level: O3

void __thiscall Assimp::Profiling::Profiler::EndRegion(Profiler *this,string *region)

{
  long lVar1;
  iterator iVar2;
  long lVar3;
  mapped_type *pmVar4;
  Logger *this_00;
  char *local_1b8;
  char local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  *)this,region);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->regions)._M_t._M_impl.super__Rb_tree_header) {
    lVar3 = std::chrono::_V2::system_clock::now();
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ::operator[](&this->regions,region);
    lVar1 = (pmVar4->__d).__r;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[8]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [8])"END   `");
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,(region->_M_dataplus)._M_p,region->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"`, dt= ",7);
    std::ostream::_M_insert<double>((double)(lVar3 - lVar1) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(local_198," s",2);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void EndRegion(const std::string& region) {
        RegionMap::const_iterator it = regions.find(region);
        if (it == regions.end()) {
            return;
        }

        std::chrono::duration<double> elapsedSeconds = std::chrono::system_clock::now() - regions[region];
        ASSIMP_LOG_DEBUG((format("END   `"),region,"`, dt= ", elapsedSeconds.count()," s"));
    }